

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O1

int read_StreamsInfo(archive_read *a,_7z_stream_info *si)

{
  _7z_coders_info *val;
  byte bVar1;
  void *pvVar2;
  _7z_folder *p_Var3;
  _7z_coder *p_Var4;
  uchar uVar5;
  int iVar6;
  uchar *puVar7;
  uchar *puVar8;
  uint64_t *puVar9;
  uint64_t *puVar10;
  uint32_t *puVar11;
  _7z_folder *p_Var12;
  _7z_coder *p_Var13;
  byte *pbVar14;
  uchar *__dest;
  anon_struct_16_2_4d417c8e *paVar15;
  ulong *puVar16;
  uint64_t *puVar17;
  uint64_t uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  size_t num;
  ulong uVar22;
  uint uVar23;
  size_t sVar24;
  size_t __nmemb;
  long lVar25;
  bool bVar26;
  ulong local_70;
  uint64_t local_60;
  _7z_digests local_58;
  ulong local_40;
  void *local_38;
  
  pvVar2 = a->format->data;
  (si->ss).unpackSizes = (uint64_t *)0x0;
  (si->ss).digestsDefined = (uchar *)0x0;
  (si->ci).dataStreamIndex = 0;
  (si->ss).unpack_streams = 0;
  (si->ci).numFolders = 0;
  (si->ci).folders = (_7z_folder *)0x0;
  (si->pi).digest.digests = (uint32_t *)0x0;
  (si->pi).positions = (uint64_t *)0x0;
  (si->pi).sizes = (uint64_t *)0x0;
  (si->pi).digest.defineds = (uchar *)0x0;
  (si->pi).pos = 0;
  (si->pi).numPackStreams = 0;
  (si->ss).digests = (uint32_t *)0x0;
  puVar7 = header_bytes(a,1);
  if (puVar7 == (uchar *)0x0) {
    return -1;
  }
  if (*puVar7 == '\x06') {
    (si->pi).digest.digests = (uint32_t *)0x0;
    (si->pi).positions = (uint64_t *)0x0;
    (si->pi).sizes = (uint64_t *)0x0;
    (si->pi).digest.defineds = (uchar *)0x0;
    (si->pi).pos = 0;
    (si->pi).numPackStreams = 0;
    iVar6 = parse_7zip_uint64(a,(uint64_t *)si);
    if (iVar6 < 0) goto LAB_0043bab7;
    puVar17 = &(si->pi).numPackStreams;
    iVar6 = parse_7zip_uint64(a,puVar17);
    if (((iVar6 < 0) || (*puVar17 - 0x5f5e101 < 0xfffffffffa0a1f00)) ||
       (puVar8 = header_bytes(a,1), puVar8 == (uchar *)0x0)) {
LAB_0043ba52:
      bVar26 = false;
    }
    else {
      if (*puVar8 != '\0') {
        if (*puVar8 == '\t') {
          sVar24 = (si->pi).numPackStreams;
          puVar9 = (uint64_t *)calloc(sVar24,8);
          (si->pi).sizes = puVar9;
          puVar10 = (uint64_t *)calloc(sVar24,8);
          (si->pi).positions = puVar10;
          if (puVar10 != (uint64_t *)0x0 && puVar9 != (uint64_t *)0x0) {
            if (sVar24 != 0) {
              uVar23 = 1;
              uVar20 = 0;
              do {
                iVar6 = parse_7zip_uint64(a,(si->pi).sizes + uVar20);
                if (iVar6 < 0) goto LAB_0043ba52;
                uVar20 = (ulong)uVar23;
                uVar23 = uVar23 + 1;
              } while (uVar20 < *puVar17);
            }
            puVar8 = header_bytes(a,1);
            if (puVar8 != (uchar *)0x0) {
              if (*puVar8 == '\t') {
                iVar6 = read_Digests(a,&(si->pi).digest,(si->pi).numPackStreams);
                if ((-1 < iVar6) && (puVar8 = header_bytes(a,1), puVar8 != (uchar *)0x0)) {
                  bVar26 = *puVar8 != '\0';
                  goto LAB_0043ba4e;
                }
              }
              else if (*puVar8 == '\0') {
                sVar24 = (si->pi).numPackStreams;
                puVar8 = (uchar *)calloc(sVar24,1);
                (si->pi).digest.defineds = puVar8;
                puVar11 = (uint32_t *)calloc(sVar24,4);
                (si->pi).digest.digests = puVar11;
                bVar26 = puVar11 == (uint32_t *)0x0 || puVar8 == (uchar *)0x0;
LAB_0043ba4e:
                if (!bVar26) goto LAB_0043ba5b;
                goto LAB_0043ba52;
              }
LAB_0043bab7:
              bVar26 = false;
              goto LAB_0043bab9;
            }
          }
        }
        goto LAB_0043ba52;
      }
LAB_0043ba5b:
      puVar17 = (si->pi).positions;
      if ((puVar17 == (uint64_t *)0x0) || (puVar9 = (si->pi).sizes, puVar9 == (uint64_t *)0x0))
      goto LAB_0043bab7;
      if ((si->pi).numPackStreams != 0) {
        uVar20 = (si->pi).pos;
        uVar23 = 1;
        uVar19 = 0;
        do {
          puVar17[uVar19] = uVar20;
          uVar20 = uVar20 + puVar9[uVar19];
          if (*(ulong *)((long)pvVar2 + 0x80) < uVar20) goto LAB_0043bab7;
          uVar19 = (ulong)uVar23;
          uVar23 = uVar23 + 1;
        } while (uVar19 < (si->pi).numPackStreams);
      }
      puVar7 = header_bytes(a,1);
      bVar26 = puVar7 != (uchar *)0x0;
    }
LAB_0043bab9:
    if (!bVar26) {
      return -1;
    }
  }
  if (*puVar7 == '\a') {
    (si->ci).numFolders = 0;
    (si->ci).folders = (_7z_folder *)0x0;
    (si->ci).dataStreamIndex = 0;
    local_58.defineds = (uchar *)0x0;
    local_58.digests = (uint32_t *)0x0;
    puVar8 = header_bytes(a,1);
    if ((puVar8 == (uchar *)0x0) || (*puVar8 != '\v')) {
LAB_0043c021:
      free(local_58.defineds);
      free(local_58.digests);
LAB_0043c038:
      bVar26 = false;
    }
    else {
      val = &si->ci;
      iVar6 = parse_7zip_uint64(a,&val->numFolders);
      if (iVar6 < 0) goto LAB_0043c021;
      if (100000000 < val->numFolders) goto LAB_0043c038;
      puVar8 = header_bytes(a,1);
      if (puVar8 == (uchar *)0x0) goto LAB_0043c021;
      if (*puVar8 == '\x01') {
        puVar17 = &(si->ci).dataStreamIndex;
        iVar6 = parse_7zip_uint64(a,puVar17);
        if ((iVar6 < 0) || (100000000 < *puVar17)) goto LAB_0043c038;
        if (val->numFolders == 0) goto LAB_0043c44e;
LAB_0043c00b:
        archive_set_error(&a->archive,-1,"Malformed 7-Zip archive");
        goto LAB_0043c021;
      }
      if (*puVar8 != '\0') goto LAB_0043c00b;
      sVar24 = (si->ci).numFolders;
      p_Var12 = (_7z_folder *)calloc(sVar24,0x68);
      (si->ci).folders = p_Var12;
      if (p_Var12 == (_7z_folder *)0x0) goto LAB_0043c038;
      if (sVar24 != 0) {
        uVar20 = 0;
        do {
          p_Var3 = (si->ci).folders;
          p_Var12 = p_Var3 + uVar20;
          local_38 = a->format->data;
          p_Var3[uVar20].numUnpackStreams = 0;
          (&p_Var3[uVar20].numUnpackStreams)[1] = 0;
          p_Var3[uVar20].unPackSize = (uint64_t *)0x0;
          (&p_Var3[uVar20].unPackSize)[1] = (uint64_t *)0x0;
          p_Var3[uVar20].numInStreams = 0;
          (&p_Var3[uVar20].numInStreams)[1] = 0;
          p_Var3[uVar20].numPackedStreams = 0;
          (&p_Var3[uVar20].numPackedStreams)[1] = 0;
          p_Var3[uVar20].numBindPairs = 0;
          (&p_Var3[uVar20].numBindPairs)[1] = 0;
          p_Var3[uVar20].numCoders = 0;
          p_Var3[uVar20].coders = (_7z_coder *)0x0;
          p_Var3[uVar20].skipped_bytes = 0;
          local_40 = uVar20;
          iVar6 = parse_7zip_uint64(a,&p_Var12->numCoders);
          if ((iVar6 < 0) || (uVar20 = p_Var12->numCoders, 4 < uVar20)) goto LAB_0043c021;
          p_Var13 = (_7z_coder *)calloc(uVar20,0x28);
          p_Var12->coders = p_Var13;
          if (p_Var13 == (_7z_coder *)0x0) goto LAB_0043c021;
          if (uVar20 == 0) {
            local_60 = 0;
            local_70 = 0;
          }
          else {
            uVar20 = 0;
            local_70 = 0;
            local_60 = 0;
            do {
              pbVar14 = header_bytes(a,1);
              if ((pbVar14 == (byte *)0x0) || (bVar1 = *pbVar14, (char)bVar1 < '\0')) {
LAB_0043bdc7:
                bVar26 = false;
              }
              else {
                puVar8 = header_bytes(a,(ulong)(bVar1 & 0xf));
                if (puVar8 == (uchar *)0x0) goto LAB_0043bdc7;
                if ((bVar1 & 0xf) == 0) {
                  uVar19 = 0;
                }
                else {
                  uVar21 = 0;
                  uVar19 = 0;
                  do {
                    uVar19 = uVar19 << 8 | (ulong)puVar8[uVar21];
                    uVar21 = uVar21 + 1;
                  } while ((bVar1 & 0xf) != uVar21);
                }
                p_Var4 = p_Var12->coders;
                p_Var13 = p_Var4 + uVar20;
                puVar17 = &p_Var13->numInStreams;
                p_Var13->codec = uVar19;
                if ((bVar1 & 0x10) == 0) {
                  *puVar17 = 1;
                  p_Var4[uVar20].numOutStreams = 1;
LAB_0043bcc8:
                  if ((bVar1 & 0x20) != 0) {
                    iVar6 = parse_7zip_uint64(a,&p_Var12->coders[uVar20].propertiesSize);
                    if ((-1 < iVar6) &&
                       (puVar8 = header_bytes(a,p_Var12->coders[uVar20].propertiesSize),
                       puVar8 != (uchar *)0x0)) {
                      p_Var13 = p_Var12->coders;
                      __dest = (uchar *)malloc(p_Var13[uVar20].propertiesSize);
                      p_Var13[uVar20].properties = __dest;
                      if (__dest != (uchar *)0x0) {
                        memcpy(__dest,puVar8,p_Var13[uVar20].propertiesSize);
                        goto LAB_0043bcd2;
                      }
                    }
                    goto LAB_0043bdc7;
                  }
LAB_0043bcd2:
                  local_70 = local_70 + p_Var12->coders[uVar20].numInStreams;
                  local_60 = local_60 + p_Var12->coders[uVar20].numOutStreams;
                  bVar26 = true;
                }
                else {
                  iVar6 = parse_7zip_uint64(a,puVar17);
                  if (iVar6 < 0) goto LAB_0043bdc7;
                  if (p_Var12->coders[uVar20].numInStreams < 0x5f5e101) {
                    iVar6 = parse_7zip_uint64(a,&p_Var12->coders[uVar20].numOutStreams);
                    if (iVar6 < 0) goto LAB_0043bdc7;
                    if (p_Var12->coders[uVar20].numOutStreams < 0x5f5e101) goto LAB_0043bcc8;
                  }
                  bVar26 = false;
                }
              }
              if (!bVar26) goto LAB_0043c021;
              uVar20 = (ulong)((int)uVar20 + 1);
            } while (uVar20 < p_Var12->numCoders);
          }
          if (((local_60 == 0) || (sVar24 = local_60 - 1, local_70 < sVar24)) ||
             (p_Var12->numBindPairs = sVar24, *(ulong *)((long)local_38 + 0x70) < sVar24))
          goto LAB_0043c021;
          if (sVar24 == 0) {
            p_Var12->bindPairs = (anon_struct_16_2_4d417c8e *)0x0;
          }
          else {
            paVar15 = (anon_struct_16_2_4d417c8e *)calloc(sVar24,0x10);
            p_Var12->bindPairs = paVar15;
            if (paVar15 == (anon_struct_16_2_4d417c8e *)0x0) goto LAB_0043c021;
          }
          if (sVar24 != 0) {
            uVar20 = 0;
            uVar19 = 1;
            do {
              iVar6 = parse_7zip_uint64(a,&p_Var12->bindPairs[uVar20].inIndex);
              if (((iVar6 < 0) || (100000000 < p_Var12->bindPairs[uVar20].inIndex)) ||
                 ((iVar6 = parse_7zip_uint64(a,&p_Var12->bindPairs[uVar20].outIndex), iVar6 < 0 ||
                  (100000000 < p_Var12->bindPairs[uVar20].outIndex)))) goto LAB_0043c021;
              sVar24 = p_Var12->numBindPairs;
              bVar26 = uVar19 < sVar24;
              uVar20 = uVar19;
              uVar19 = (ulong)((int)uVar19 + 1);
            } while (bVar26);
          }
          __nmemb = local_70 - sVar24;
          p_Var12->numPackedStreams = __nmemb;
          puVar16 = (ulong *)calloc(__nmemb,8);
          p_Var12->packedStreams = puVar16;
          if (puVar16 == (ulong *)0x0) goto LAB_0043c021;
          if (__nmemb != 0) {
            if (__nmemb == 1) {
              if (local_70 == 0) {
                uVar20 = 0;
              }
              else {
                uVar20 = 0;
                do {
                  if (sVar24 == 0) {
                    uVar19 = 0;
                  }
                  else {
                    uVar23 = 1;
                    uVar19 = 0;
                    do {
                      if (p_Var12->bindPairs[uVar19].inIndex == uVar20) break;
                      uVar19 = (ulong)uVar23;
                      uVar23 = uVar23 + 1;
                    } while (uVar19 < sVar24);
                  }
                } while ((sVar24 != uVar19) &&
                        (uVar20 = (ulong)((int)uVar20 + 1), uVar20 < local_70));
              }
              if (local_70 == uVar20) goto LAB_0043c021;
              *puVar16 = uVar20;
            }
            else {
              uVar23 = 1;
              uVar20 = 0;
              do {
                iVar6 = parse_7zip_uint64(a,p_Var12->packedStreams + uVar20);
                if ((iVar6 < 0) || (100000000 < p_Var12->packedStreams[uVar20])) goto LAB_0043c021;
                uVar20 = (ulong)uVar23;
                uVar23 = uVar23 + 1;
              } while (uVar20 < p_Var12->numPackedStreams);
            }
          }
          p_Var12->numInStreams = local_70;
          p_Var12->numOutStreams = local_60;
          uVar20 = (ulong)((int)local_40 + 1);
        } while (uVar20 < val->numFolders);
      }
LAB_0043c44e:
      puVar8 = header_bytes(a,1);
      if ((puVar8 == (uchar *)0x0) || (*puVar8 != '\f')) goto LAB_0043c021;
      if (val->numFolders != 0) {
        uVar20 = 0;
        do {
          p_Var12 = (si->ci).folders;
          sVar24 = p_Var12[uVar20].numOutStreams;
          puVar17 = (uint64_t *)calloc(sVar24,8);
          p_Var12[uVar20].unPackSize = puVar17;
          if (puVar17 == (uint64_t *)0x0) goto LAB_0043c021;
          if (sVar24 != 0) {
            uVar23 = 1;
            uVar19 = 0;
            do {
              iVar6 = parse_7zip_uint64(a,p_Var12[uVar20].unPackSize + uVar19);
              if (iVar6 < 0) goto LAB_0043c021;
              uVar19 = (ulong)uVar23;
              uVar23 = uVar23 + 1;
            } while (uVar19 < p_Var12[uVar20].numOutStreams);
          }
          uVar20 = (ulong)((int)uVar20 + 1);
        } while (uVar20 < val->numFolders);
      }
      puVar8 = header_bytes(a,1);
      if (puVar8 == (uchar *)0x0) goto LAB_0043c021;
      if (*puVar8 != '\0') {
        if ((*puVar8 == '\n') && (iVar6 = read_Digests(a,&local_58,val->numFolders), -1 < iVar6)) {
          uVar20 = val->numFolders;
          if (uVar20 != 0) {
            puVar11 = &((si->ci).folders)->digest;
            uVar19 = 0;
            do {
              *(uchar *)(puVar11 + -1) = local_58.defineds[uVar19];
              *puVar11 = local_58.digests[uVar19];
              uVar19 = uVar19 + 1;
              puVar11 = puVar11 + 0x1a;
            } while ((uVar19 & 0xffffffff) < uVar20);
          }
          puVar8 = header_bytes(a,1);
          if ((puVar8 != (uchar *)0x0) && (*puVar8 == '\0')) {
            free(local_58.defineds);
            free(local_58.digests);
            goto LAB_0043c5a0;
          }
        }
        goto LAB_0043c021;
      }
LAB_0043c5a0:
      uVar20 = (si->ci).numFolders;
      if (uVar20 != 0) {
        p_Var12 = (si->ci).folders;
        uVar19 = (si->pi).numPackStreams;
        uVar22 = 0;
        uVar23 = 1;
        uVar21 = 0;
        do {
          p_Var12[uVar22].packIndex = (uint32_t)uVar21;
          uVar21 = (ulong)((uint32_t)uVar21 + (int)p_Var12[uVar22].numPackedStreams);
          if (uVar19 < uVar21) {
            bVar26 = false;
            goto LAB_0043c03a;
          }
          uVar22 = (ulong)uVar23;
          uVar23 = uVar23 + 1;
        } while (uVar22 < uVar20);
      }
      puVar7 = header_bytes(a,1);
      bVar26 = puVar7 != (uchar *)0x0;
    }
LAB_0043c03a:
    if (!bVar26) {
      return -1;
    }
  }
  if (*puVar7 != '\b') goto LAB_0043c432;
  uVar20 = (si->ci).numFolders;
  p_Var12 = (si->ci).folders;
  (si->ss).unpack_streams = 0;
  (si->ss).unpackSizes = (uint64_t *)0x0;
  (si->ss).digestsDefined = (uchar *)0x0;
  (si->ss).digests = (uint32_t *)0x0;
  if (uVar20 != 0) {
    puVar17 = &p_Var12->numUnpackStreams;
    uVar19 = 1;
    do {
      *puVar17 = 1;
      puVar17 = puVar17 + 0xd;
      bVar26 = uVar19 < uVar20;
      uVar19 = (ulong)((int)uVar19 + 1);
    } while (bVar26);
  }
  puVar7 = header_bytes(a,1);
  if (puVar7 == (uchar *)0x0) {
    return -1;
  }
  uVar5 = *puVar7;
  uVar19 = uVar20;
  if (uVar5 == '\r') {
    if (uVar20 == 0) {
      uVar19 = 0;
    }
    else {
      uVar19 = 0;
      uVar21 = 0;
      uVar22 = 1;
      do {
        iVar6 = parse_7zip_uint64(a,&p_Var12[uVar21].numUnpackStreams);
        if (iVar6 < 0) {
          return -1;
        }
        uVar21 = p_Var12[uVar21].numUnpackStreams;
        if (100000000 < uVar21) {
          return -1;
        }
        if (0xfffffffffa0a1eff < uVar19) {
          return -1;
        }
        uVar19 = uVar19 + uVar21;
        bVar26 = uVar22 < uVar20;
        uVar21 = uVar22;
        uVar22 = (ulong)((int)uVar22 + 1);
      } while (bVar26);
    }
    puVar7 = header_bytes(a,1);
    if (puVar7 == (uchar *)0x0) {
      return -1;
    }
    uVar5 = *puVar7;
  }
  (si->ss).unpack_streams = uVar19;
  if (uVar19 != 0) {
    puVar17 = (uint64_t *)calloc(uVar19,8);
    (si->ss).unpackSizes = puVar17;
    puVar7 = (uchar *)calloc(uVar19,1);
    (si->ss).digestsDefined = puVar7;
    puVar11 = (uint32_t *)calloc(uVar19,4);
    (si->ss).digests = puVar11;
    if (puVar17 == (uint64_t *)0x0) {
      return -1;
    }
    if (puVar11 == (uint32_t *)0x0 || puVar7 == (uchar *)0x0) {
      return -1;
    }
  }
  if (uVar20 != 0) {
    puVar17 = (si->ss).unpackSizes;
    uVar21 = 0;
    do {
      if (p_Var12[uVar21].numUnpackStreams == 0) {
        iVar6 = 10;
      }
      else {
        if ((uVar5 == '\t') && (p_Var12[uVar21].numUnpackStreams != 1)) {
          lVar25 = 0;
          uVar22 = 2;
          do {
            iVar6 = parse_7zip_uint64(a,puVar17);
            if (iVar6 < 0) {
              iVar6 = 1;
              goto LAB_0043c265;
            }
            lVar25 = lVar25 + *puVar17;
            puVar17 = puVar17 + 1;
            bVar26 = uVar22 < p_Var12[uVar21].numUnpackStreams;
            uVar22 = (ulong)((int)uVar22 + 1);
          } while (bVar26);
        }
        else {
          lVar25 = 0;
        }
        uVar18 = folder_uncompressed_size(p_Var12 + uVar21);
        *puVar17 = uVar18 - lVar25;
        puVar17 = puVar17 + 1;
        iVar6 = 0;
      }
LAB_0043c265:
      if ((iVar6 != 10) && (iVar6 != 0)) {
        return -1;
      }
      uVar21 = (ulong)((int)uVar21 + 1);
    } while (uVar21 < uVar20);
  }
  if (uVar5 == '\t') {
    puVar7 = header_bytes(a,1);
    if (puVar7 == (uchar *)0x0) {
      return -1;
    }
    uVar5 = *puVar7;
  }
  if (uVar19 != 0) {
    uVar21 = 0;
    do {
      (si->ss).digestsDefined[uVar21] = '\0';
      (si->ss).digests[uVar21] = 0;
      uVar21 = uVar21 + 1;
    } while ((uVar21 & 0xffffffff) < uVar19);
  }
  num = 0;
  if (uVar20 != 0) {
    puVar17 = &p_Var12->numUnpackStreams;
    uVar23 = 1;
    do {
      if ((*puVar17 != 1) || (*(uchar *)(puVar17 + -1) == '\0')) {
        num = (size_t)(uint)((int)num + (int)*puVar17);
      }
      uVar19 = (ulong)uVar23;
      puVar17 = puVar17 + 0xd;
      uVar23 = uVar23 + 1;
    } while (uVar19 < uVar20);
  }
  if (uVar5 == '\n') {
    puVar7 = (si->ss).digestsDefined;
    puVar11 = (si->ss).digests;
    local_58.defineds = (uchar *)0x0;
    local_58.digests = (uint32_t *)0x0;
    iVar6 = read_Digests(a,&local_58,num);
    if (iVar6 < 0) {
      free(local_58.defineds);
      free(local_58.digests);
LAB_0043c40e:
      uVar5 = '\n';
      bVar26 = false;
    }
    else {
      if (uVar20 != 0) {
        uVar19 = 0;
        lVar25 = 0;
        do {
          if (p_Var12[uVar19].numUnpackStreams != 0) {
            if ((p_Var12[uVar19].numUnpackStreams == 1) && (p_Var12[uVar19].digest_defined != '\0'))
            {
              *puVar7 = '\x01';
              puVar7 = puVar7 + 1;
              *puVar11 = p_Var12[uVar19].digest;
              puVar11 = puVar11 + 1;
            }
            else {
              lVar25 = (long)(int)lVar25;
              uVar23 = 1;
              do {
                *puVar7 = local_58.defineds[lVar25];
                puVar7 = puVar7 + 1;
                *puVar11 = local_58.digests[lVar25];
                puVar11 = puVar11 + 1;
                lVar25 = lVar25 + 1;
                uVar21 = (ulong)uVar23;
                uVar23 = uVar23 + 1;
              } while (uVar21 < p_Var12[uVar19].numUnpackStreams);
            }
          }
          uVar19 = uVar19 + 1;
        } while ((uVar19 & 0xffffffff) < uVar20);
      }
      free(local_58.defineds);
      free(local_58.digests);
      puVar7 = header_bytes(a,1);
      if (puVar7 == (uchar *)0x0) goto LAB_0043c40e;
      uVar5 = *puVar7;
      bVar26 = true;
    }
    if (!bVar26) {
      return -1;
    }
  }
  if (uVar5 != '\0') {
    return -1;
  }
  puVar7 = header_bytes(a,1);
  if (puVar7 == (uchar *)0x0) {
    return -1;
  }
LAB_0043c432:
  return -(uint)(*puVar7 != '\0');
}

Assistant:

static int
read_StreamsInfo(struct archive_read *a, struct _7z_stream_info *si)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;
	const unsigned char *p;
	unsigned i;

	memset(si, 0, sizeof(*si));

	if ((p = header_bytes(a, 1)) == NULL)
		return (-1);
	if (*p == kPackInfo) {
		uint64_t packPos;

		if (read_PackInfo(a, &(si->pi)) < 0)
			return (-1);

		if (si->pi.positions == NULL || si->pi.sizes == NULL)
			return (-1);
		/*
		 * Calculate packed stream positions.
		 */
		packPos = si->pi.pos;
		for (i = 0; i < si->pi.numPackStreams; i++) {
			si->pi.positions[i] = packPos;
			packPos += si->pi.sizes[i];
			if (packPos > zip->header_offset)
				return (-1);
		}
		if ((p = header_bytes(a, 1)) == NULL)
			return (-1);
	}
	if (*p == kUnPackInfo) {
		uint32_t packIndex;
		struct _7z_folder *f;

		if (read_CodersInfo(a, &(si->ci)) < 0)
			return (-1);

		/*
		 * Calculate packed stream indexes.
		 */
		packIndex = 0;
		f = si->ci.folders;
		for (i = 0; i < si->ci.numFolders; i++) {
			f[i].packIndex = packIndex;
			packIndex += (uint32_t)f[i].numPackedStreams;
			if (packIndex > si->pi.numPackStreams)
				return (-1);
		}
		if ((p = header_bytes(a, 1)) == NULL)
			return (-1);
	}

	if (*p == kSubStreamsInfo) {
		if (read_SubStreamsInfo(a, &(si->ss),
		    si->ci.folders, (size_t)si->ci.numFolders) < 0)
			return (-1);
		if ((p = header_bytes(a, 1)) == NULL)
			return (-1);
	}

	/*
	 *  Must be kEnd.
	 */
	if (*p != kEnd)
		return (-1);
	return (0);
}